

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O0

void __thiscall ASDCP::MXF::Primer::TagForKey(Primer *this)

{
  TagValue *in_RDX;
  long in_RSI;
  
  TagForKey(this,(UL *)(in_RSI + -0x70),in_RDX);
  return;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::Primer::TagForKey(const ASDCP::UL& Key, ASDCP::TagValue& Tag)
{
  
  if ( !m_Lookup || m_Lookup.empty() )
    {
      DefaultLogSink().Error("Primer lookup is empty\n");
      return RESULT_FAIL;
    }

  std::map<UL, TagValue>::iterator i = m_Lookup->find(Key);

  if ( i == m_Lookup->end() )
    return RESULT_FALSE;

  Tag = (*i).second;
  return RESULT_OK;
}